

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O0

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
slang::ast::
createAttributes<slang::ast::AttributeSymbol::fromSyntax(std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>,slang::ast::Scope_const&,slang::ast::LookupLocation)::__0>
          (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,anon_class_16_2_e52d6572 *factory)

{
  basic_string_view<char,_std::char_traits<char>_> name_00;
  Symbol *pSVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  reference ppAVar5;
  pointer ppVar6;
  reference ppAVar7;
  size_type sVar8;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
  *pSVar9;
  unsigned_long *args_2;
  undefined4 extraout_var;
  pointer in_RDX;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::AttributeSymbol_*,_18446744073709551615UL> *__s;
  const_iterator cVar10;
  string_view sVar11;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar12;
  iterator it;
  ConstantValue value;
  AttributeSymbol *attr;
  string_view name;
  AttributeSpecSyntax *spec;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range3;
  AttributeInstanceSyntax *inst;
  iterator __end2;
  iterator __begin2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *__range2;
  Compilation *comp;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff9d8;
  Compilation *in_stack_fffffffffffff9e0;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffff9e8;
  SourceLocation in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  SourceLocation *in_stack_fffffffffffffa00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa08;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  *in_stack_fffffffffffffa10;
  Diagnostic *in_stack_fffffffffffffa20;
  size_t in_stack_fffffffffffffa28;
  Diagnostic *in_stack_fffffffffffffa30;
  Diagnostic *pDVar13;
  AttributeSymbol *in_stack_fffffffffffffa58;
  Diagnostic *in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  Scope *this;
  Scope *this_00;
  SourceLocation location;
  DiagCode in_stack_fffffffffffffa94;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_488;
  undefined1 local_470 [16];
  char *pcStack_460;
  SourceLocation local_450;
  undefined4 local_444;
  iterator local_440;
  Scope *local_430;
  SourceLocation local_428;
  SourceLocation local_420;
  string_view local_418;
  SourceLocation local_408;
  AttributeSymbol *local_3c8;
  undefined1 local_3c0 [32];
  size_t local_3a0;
  const_iterator local_388;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *local_378;
  AttributeInstanceSyntax *local_370;
  AttributeInstanceSyntax **local_368;
  __normal_iterator<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
  local_360;
  undefined1 *local_358;
  Compilation *local_350;
  SmallVectorBase<const_slang::ast::AttributeSymbol_*> local_348 [5];
  undefined1 local_2a0 [104];
  Symbol *local_238;
  undefined1 *local_230;
  Scope *local_228;
  SourceLocation local_220;
  basic_string_view<char,_std::char_traits<char>_> *local_218;
  basic_string_view<char,_std::char_traits<char>_> *local_210;
  Diagnostic *local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  local_200;
  Symbol *local_1e8;
  undefined1 *local_1e0;
  iterator local_1d8;
  size_t local_1c8;
  Symbol *local_1c0;
  undefined1 *local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  Symbol *local_160;
  undefined1 *local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_148;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  Diagnostic *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  local_b0;
  size_t local_98;
  unsigned_long *local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_70;
  Diagnostic *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  unsigned_long *local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  Diagnostic *local_8;
  
  local_2a0._64_8_ = in_RDX;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
              *)in_stack_fffffffffffff9f0);
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> *)0xf6cd11);
  local_350 = Scope::getCompilation((Scope *)local_2a0._64_8_);
  local_358 = local_2a0 + 0x48;
  local_360._M_current =
       (AttributeInstanceSyntax **)
       std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)in_stack_fffffffffffff9d8);
  local_368 = (AttributeInstanceSyntax **)
              std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
              ::end(in_stack_fffffffffffff9e8);
  do {
    bVar2 = __gnu_cxx::
            operator==<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff9e0,
                       (__normal_iterator<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff9d8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      iVar4 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                        (local_348,(EVP_PKEY_CTX *)local_350,src);
      std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::
      span<const_slang::ast::AttributeSymbol_*,_18446744073709551615UL>
                ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                 CONCAT44(extraout_var,iVar4),__s);
      SmallVector<const_slang::ast::AttributeSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> *)0xf6dbeb);
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                   *)0xf6dbf8);
      sVar12._M_ptr = (pointer)local_2a0._88_8_;
      sVar12._M_extent._M_extent_value = local_2a0._96_8_;
      return sVar12;
    }
    ppAVar5 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
              ::operator*(&local_360);
    local_370 = *ppAVar5;
    local_378 = &local_370->specs;
    cVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0xf6cdb9);
    local_388 = cVar10;
    cVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0xf6cdf8);
    unique0x1000182f = cVar10;
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffff9e0,
                         (iterator_base<const_slang::syntax::AttributeSpecSyntax_*> *)
                         in_stack_fffffffffffff9d8);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_3c0._16_8_ =
           iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
                        *)0xf6ce67);
      sVar11 = parsing::Token::valueText((Token *)in_stack_fffffffffffff9f0);
      local_3c0._0_16_ = (undefined1  [16])sVar11;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_3c0);
      if (!bVar2) {
        if (*(EqualsValueClauseSyntax **)(local_3c0._16_8_ + 0x28) == (EqualsValueClauseSyntax *)0x0
           ) {
          SVInt::SVInt((SVInt *)in_stack_fffffffffffff9f0,
                       (bitwidth_t)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                       (uint64_t)in_stack_fffffffffffff9e0,
                       SUB81((ulong)in_stack_fffffffffffff9d8 >> 0x38,0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff9e0,(SVInt *)in_stack_fffffffffffff9d8);
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffff9f0);
          local_408 = parsing::Token::location((Token *)(local_3c0._16_8_ + 0x18));
          Compilation::allocConstant
                    (in_stack_fffffffffffff9e0,(ConstantValue *)in_stack_fffffffffffff9d8);
          local_3c8 = BumpAllocator::
                      emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                                ((BumpAllocator *)in_stack_fffffffffffffa10,
                                 in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                                 (ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xf6cfed);
        }
        else {
          local_418 = (string_view)local_3c0._0_16_;
          local_420 = parsing::Token::location((Token *)(local_3c0._16_8_ + 0x18));
          not_null<slang::syntax::ExpressionSyntax_*>::operator*
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0xf6d0ae);
          name_00._M_len._7_1_ = in_stack_fffffffffffff9ff;
          name_00._M_len._0_7_ = in_stack_fffffffffffff9f8;
          name_00._M_str = (char *)in_stack_fffffffffffffa00;
          local_3c8 = AttributeSymbol::
                      fromSyntax(std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>,slang::ast::Scope_const&,slang::ast::LookupLocation)
                      ::$_0::operator()((anon_class_16_2_e52d6572 *)in_stack_fffffffffffff9e8,
                                        in_stack_fffffffffffff9e0,name_00,in_stack_fffffffffffff9f0,
                                        (ExpressionSyntax *)in_stack_fffffffffffff9d8);
        }
        Symbol::setSyntax(&local_3c8->super_Symbol,(SyntaxNode *)local_3c0._16_8_);
        local_238 = (Symbol *)local_3c0;
        local_230 = local_2a0;
        local_1e8 = local_238;
        local_1e0 = local_2a0;
        local_1c0 = local_238;
        local_1b8 = local_2a0;
        local_1c8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                    ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        pSVar1 = local_1c0;
        local_168 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                    *)in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
        local_160 = pSVar1;
        local_170 = local_1c8;
        local_158 = local_2a0;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_180,local_168);
        do {
          local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_180);
          local_190 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                      ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                *)0xf6d26d);
          local_190 = local_190 + local_188;
          local_194 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff9e8,(size_t)in_stack_fffffffffffff9e0);
          if (local_194 != 0) {
            local_1a0 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                        ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                    *)0xf6d2cf);
            local_1a8 = local_1a0 + local_188 * 0xf;
            do {
              local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                      *)0xf6d322);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                          *)0xf6d356);
              bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffffa00,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffff9f0);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                ::table_locator(&local_200,local_190,local_1ac,local_1a8 + local_1ac);
                goto LAB_00f6d472;
              }
              local_194 = local_194 - 1 & local_194;
            } while (local_194 != 0);
          }
          bVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
          in_stack_fffffffffffffa94.code._1_1_ = bVar2;
          if (bVar2) {
            memset(&local_200,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
            ::table_locator(&local_200);
            goto LAB_00f6d472;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_180,local_2a0._16_8_);
        } while (bVar2);
        memset(&local_200,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
        ::table_locator(&local_200);
LAB_00f6d472:
        local_1d8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                    ::make_iterator((locator *)0xf6d483);
        local_228 = (Scope *)local_1d8.pc_;
        local_220 = (SourceLocation)local_1d8.p_;
        local_430 = (Scope *)local_1d8.pc_;
        local_428 = (SourceLocation)local_1d8.p_;
        this = (Scope *)local_1d8.pc_;
        this_00 = (Scope *)local_1d8.pc_;
        location = (SourceLocation)local_1d8.p_;
        local_440 = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                           *)0xf6d520);
        uVar3 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff9e0,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff9d8);
        if ((bool)uVar3) {
          local_444 = 0xed0006;
          local_450 = (local_3c8->super_Symbol).location;
          in_stack_fffffffffffffa60 = Scope::addDiag(this_00,in_stack_fffffffffffffa94,location);
          sVar11._M_str = (char *)in_stack_fffffffffffffa30;
          sVar11._M_len = in_stack_fffffffffffffa28;
          unique0x1000183f = (string_view)local_3c0._0_16_;
          Diagnostic::operator<<(in_stack_fffffffffffffa20,sVar11);
          in_stack_fffffffffffffa58 = local_3c8;
          ppVar6 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)in_stack_fffffffffffff9e0);
          ppAVar7 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::operator[]
                              (local_348,ppVar6->second);
          *ppAVar7 = in_stack_fffffffffffffa58;
        }
        else {
          SmallVectorBase<const_slang::ast::AttributeSymbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::AttributeSymbol_*> *)
                     in_stack_fffffffffffff9e0,(AttributeSymbol **)in_stack_fffffffffffff9d8);
          pDVar13 = (Diagnostic *)local_2a0;
          sVar8 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::size(local_348);
          local_470._0_8_ = sVar8 - 1;
          local_210 = (basic_string_view<char,_std::char_traits<char>_> *)local_3c0;
          local_218 = (basic_string_view<char,_std::char_traits<char>_> *)local_470;
          in_stack_fffffffffffffa30 = pDVar13;
          local_208 = pDVar13;
          local_140 = local_218;
          local_138 = local_210;
          local_130 = pDVar13;
          pSVar9 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                   ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                         *)0xf6d6be);
          boost::unordered::detail::foa::
          alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
          ::alloc_cted_or_fwded_key_type(&local_148,pSVar9,local_138);
          local_78 = boost::unordered::detail::foa::
                     alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                     ::move_or_fwd(&local_148);
          local_70 = &local_149;
          local_80 = local_140;
          local_68 = pDVar13;
          local_88 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                     ::key_from<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>
                               (local_78,local_140);
          args_2 = (unsigned_long *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                               *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
          local_90 = args_2;
          in_stack_fffffffffffffa28 =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                               *)in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
          local_10 = local_88;
          local_20 = local_90;
          in_stack_fffffffffffffa20 = pDVar13;
          local_98 = in_stack_fffffffffffffa28;
          local_18 = in_stack_fffffffffffffa28;
          local_8 = pDVar13;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_30,in_stack_fffffffffffffa28);
          do {
            local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
            local_40 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                       ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                 *)0xf6d815);
            local_40 = local_40 + local_38;
            local_44 = boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::match
                                 ((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff9e8,(size_t)in_stack_fffffffffffff9e0);
            if (local_44 != 0) {
              local_50 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                         ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                                     *)0xf6d86e);
              local_58 = local_50 + local_38 * 0xf;
              do {
                local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                in_stack_fffffffffffffa00 =
                     (SourceLocation *)
                     boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                             *)0xf6d8be);
                in_stack_fffffffffffffa08 = local_10;
                in_stack_fffffffffffffa10 =
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                      *)boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                        ::
                        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                                    *)0xf6d8ec);
                bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_fffffffffffffa00,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff9f0);
                if (bVar2) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                  ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                  goto LAB_00f6d9f3;
                }
                local_44 = local_44 - 1 & local_44;
              } while (local_44 != 0);
            }
            in_stack_fffffffffffff9ff =
                 boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
            if ((bool)in_stack_fffffffffffff9ff) {
              memset(&local_b0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
              ::table_locator(&local_b0);
              goto LAB_00f6d9f3;
            }
            bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_30,
                               (size_t)(in_stack_fffffffffffffa20->args).
                                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          } while (bVar2);
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
          ::table_locator(&local_b0);
LAB_00f6d9f3:
          bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_b0);
          if (bVar2) {
            local_c0 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                       ::make_iterator((locator *)0xf6da13);
            local_c1 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_488,&local_c0,&local_c1);
          }
          else if ((pDVar13->notes).
                   super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl
                   .super__Vector_impl_data._M_start <
                   (pointer)(pDVar13->ranges).
                            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            in_stack_fffffffffffff9d8 = local_80;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      (in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00,
                       (try_emplace_args_t *)
                       CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9f0
                       ,(unsigned_long *)in_stack_fffffffffffffa20);
            local_d8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                       ::make_iterator((locator *)0xf6daaf);
            local_f1[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_488,&local_d8,local_f1);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                        *)this,CONCAT17(uVar3,in_stack_fffffffffffffa68),
                       (try_emplace_args_t *)in_stack_fffffffffffffa60,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa58
                       ,args_2);
            local_108 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                        ::make_iterator((locator *)0xf6db27);
            local_121[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_488,&local_108,local_121);
          }
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<const_slang::syntax::AttributeSpecSyntax_*>,_false>
                  *)in_stack_fffffffffffff9e0);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::AttributeInstanceSyntax_*const_*,_std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>_>
    ::operator++(&local_360);
  } while( true );
}

Assistant:

static std::span<const AttributeSymbol* const> createAttributes(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope, TFunc&& factory) {

    SmallMap<std::string_view, size_t, 4> nameMap;
    SmallVector<const AttributeSymbol*> attrs;

    auto& comp = scope.getCompilation();
    for (auto inst : syntax) {
        for (auto spec : inst->specs) {
            auto name = spec->name.valueText();
            if (name.empty())
                continue;

            AttributeSymbol* attr;
            if (!spec->value) {
                ConstantValue value = SVInt(1, 1, false);
                attr = comp.emplace<AttributeSymbol>(name, spec->name.location(),
                                                     *comp.allocConstant(std::move(value)));
            }
            else {
                attr = factory(comp, name, spec->name.location(), *spec->value->expr);
            }

            attr->setSyntax(*spec);

            if (auto it = nameMap.find(name); it != nameMap.end()) {
                scope.addDiag(diag::DuplicateAttribute, attr->location) << name;
                attrs[it->second] = attr;
            }
            else {
                attrs.push_back(attr);
                nameMap.emplace(name, attrs.size() - 1);
            }
        }
    }

    return attrs.copy(comp);
}